

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O2

size_t __thiscall
jrtplib::RTCPCompoundPacketBuilder::SDESSource::NeededBytesWithExtraItem
          (SDESSource *this,uint8_t itemdatalength)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  undefined3 in_register_00000031;
  
  lVar2 = this->totalitemsize + (ulong)CONCAT31(in_register_00000031,itemdatalength) + 3;
  uVar3 = (ulong)((uint)lVar2 & 3);
  lVar1 = (((ulong)CONCAT31(in_register_00000031,itemdatalength) + this->totalitemsize) - uVar3) + 7
  ;
  if (uVar3 == 0) {
    lVar1 = lVar2;
  }
  return lVar1 + 4;
}

Assistant:

size_t NeededBytesWithExtraItem(uint8_t itemdatalength)
		{
			size_t x,r;
			x = totalitemsize + sizeof(RTCPSDESHeader) + (size_t)itemdatalength + 1;
			r = x%sizeof(uint32_t);
			if (r != 0)
				x += (sizeof(uint32_t)-r); // make sure it ends on a 32 bit boundary
			x += sizeof(uint32_t); // for ssrc
			return x;
		}